

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O0

int __thiscall arangodb::velocypack::Collection::remove(Collection *this,char *__filename)

{
  string_view attrName;
  bool bVar1;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  sub;
  int __fd;
  string key;
  ObjectIterator it;
  Builder *b;
  Value *in_stack_ffffffffffffff18;
  Slice in_stack_ffffffffffffff20;
  ObjectIterator *in_stack_ffffffffffffff28;
  Slice in_stack_ffffffffffffff30;
  undefined1 translate;
  Collection *pCVar2;
  __sv_type in_stack_ffffffffffffff50;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_a0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_98;
  uint8_t *local_90;
  char *local_68;
  Slice in_stack_ffffffffffffffa0;
  
  pCVar2 = this;
  Builder::Builder((Builder *)in_stack_ffffffffffffff50._M_len);
  Value::Value((Value *)in_stack_ffffffffffffff30._start,
               (ValueType)((ulong)in_stack_ffffffffffffff28 >> 0x38),
               SUB81((ulong)in_stack_ffffffffffffff28 >> 0x30,0));
  Builder::add((Builder *)in_stack_ffffffffffffff20._start,in_stack_ffffffffffffff18);
  local_68 = __filename;
  ObjectIterator::ObjectIterator
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff30,
             SUB81((ulong)in_stack_ffffffffffffff20._start >> 0x38,0));
  while( true ) {
    translate = (undefined1)((ulong)in_stack_ffffffffffffff30._start >> 0x38);
    __fd = (int)__filename;
    bVar1 = ObjectIterator::valid((ObjectIterator *)&stack0xffffffffffffffa0);
    if (!bVar1) break;
    in_stack_ffffffffffffff30 = ObjectIterator::key((ObjectIterator *)this,(bool)translate);
    local_90 = in_stack_ffffffffffffff30._start;
    SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::copyString_abi_cxx11_
              ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
               in_stack_ffffffffffffffa0._start);
    sub._M_cur = (__node_type *)
                 std::
                 unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_ffffffffffffff18,(key_type *)0x119ffa);
    local_98._M_cur = sub._M_cur;
    local_a0._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffff18);
    __filename = (char *)&local_a0;
    bVar1 = std::__detail::operator==
                      (&local_98,
                       (_Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        *)__filename);
    if (bVar1) {
      in_stack_ffffffffffffff50 =
           std::__cxx11::string::operator_cast_to_basic_string_view
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_ffffffffffffff20._start);
      in_stack_ffffffffffffff20 = ObjectIterator::value((ObjectIterator *)this);
      __filename = (char *)in_stack_ffffffffffffff50._M_len;
      attrName._M_str = (char *)pCVar2;
      attrName._M_len = (size_t)this;
      Builder::add((Builder *)in_stack_ffffffffffffff30._start,attrName,(Slice *)sub._M_cur);
    }
    ObjectIterator::next((ObjectIterator *)in_stack_ffffffffffffff50._M_len);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff20._start);
  }
  Builder::close((Builder *)this,__fd);
  return (int)pCVar2;
}

Assistant:

Builder Collection::remove(Slice slice,
                           std::unordered_set<std::string> const& keys) {
  Builder b;
  b.add(Value(ValueType::Object));

  ObjectIterator it(slice, /*useSequentialIteration*/ false);

  while (it.valid()) {
    auto key = it.key(true).copyString();
    if (keys.find(key) == keys.end()) {
      b.add(key, it.value());
    }
    it.next();
  }

  b.close();
  return b;
}